

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * BN_dup(BIGNUM *a)

{
  int iVar1;
  BIGNUM *a_00;
  BIGNUM *pBVar2;
  BIGNUM *ret;
  
  if (a != (BIGNUM *)0x0) {
    iVar1 = a->flags;
    a_00 = (BIGNUM *)CRYPTO_zalloc(0x18);
    if ((iVar1 & 8) == 0) {
      if (a_00 == (BIGNUM *)0x0) {
        a_00 = (BIGNUM *)0x0;
      }
      else {
        a_00->flags = 1;
      }
    }
    else {
      if (a_00 == (BIGNUM *)0x0) {
        a_00 = (BIGNUM *)0x0;
      }
      else {
        a_00->flags = 1;
      }
      if (a_00 != (BIGNUM *)0x0) {
        *(byte *)&a_00->flags = (byte)a_00->flags | 8;
      }
    }
    if (a_00 != (BIGNUM *)0x0) {
      pBVar2 = BN_copy(a_00,a);
      if (pBVar2 != (BIGNUM *)0x0) {
        return a_00;
      }
      BN_free(a_00);
    }
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_dup(const BIGNUM *a)
{
    BIGNUM *t;

    if (a == NULL)
        return NULL;
    bn_check_top(a);

    t = BN_get_flags(a, BN_FLG_SECURE) ? BN_secure_new() : BN_new();
    if (t == NULL)
        return NULL;
    if (!BN_copy(t, a)) {
        BN_free(t);
        return NULL;
    }
    bn_check_top(t);
    return t;
}